

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_perlin.h
# Opt level: O0

float stb__perlin_grad(int grad_idx,float x,float y,float z)

{
  float *grad;
  float z_local;
  float y_local;
  float x_local;
  int grad_idx_local;
  
  return stb__perlin_grad::basis[grad_idx][2] * z +
         stb__perlin_grad::basis[grad_idx][0] * x + stb__perlin_grad::basis[grad_idx][1] * y;
}

Assistant:

static float stb__perlin_grad(int grad_idx, float x, float y, float z)
{
   static float basis[12][4] =
   {
      {  1, 1, 0 },
      { -1, 1, 0 },
      {  1,-1, 0 },
      { -1,-1, 0 },
      {  1, 0, 1 },
      { -1, 0, 1 },
      {  1, 0,-1 },
      { -1, 0,-1 },
      {  0, 1, 1 },
      {  0,-1, 1 },
      {  0, 1,-1 },
      {  0,-1,-1 },
   };

   float *grad = basis[grad_idx];
   return grad[0]*x + grad[1]*y + grad[2]*z;
}